

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifySRBCompatibility
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CommittedShaderResources *Resources
          ,function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)> *CustomGetSignature)

{
  value_type pSVar1;
  bool bVar2;
  Uint32 UVar3;
  PipelineStateVkImpl *pPVar4;
  Char *pCVar5;
  PipelineResourceSignatureDesc *pPVar6;
  reference ppSVar7;
  PipelineStateDesc *Args;
  ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *pSVar8;
  ShaderResourceCacheImplType *in_RCX;
  PipelineResourceSignatureDesc *in_R8;
  PipelineStateDesc *in_stack_fffffffffffffe28;
  char (*in_stack_fffffffffffffe38) [3];
  PipelineResourceSignatureVkImpl *local_178;
  undefined1 local_158 [8];
  string msg_7;
  PipelineResourceSignatureImplType *pSRBSign;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  ShaderResourceCacheImplType *pCache;
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> pSRB;
  string msg_2;
  string msg_1;
  PipelineResourceSignatureImplType *pPSOSign;
  uint local_50;
  Uint32 sign;
  Uint32 SignCount;
  undefined1 local_40 [8];
  string msg;
  function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)> *CustomGetSignature_local;
  CommittedShaderResources *Resources_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = CustomGetSignature;
  bVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator!(&this->m_pPipelineState);
  if (bVar2) {
    FormatString<char[31]>((string *)local_40,(char (*) [31])"No PSO is bound in the context");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (ShaderResourceCacheImplType *)0xa82;
    DebugAssertionFailed
              (pCVar5,"DvpVerifySRBCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa82);
    std::__cxx11::string::~string((string *)local_40);
  }
  pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
  local_50 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                       (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  for (pPSOSign._4_4_ = 0; pPSOSign._4_4_ < local_50; pPSOSign._4_4_ = pPSOSign._4_4_ + 1) {
    bVar2 = std::function::operator_cast_to_bool((function *)CustomGetSignature);
    if (bVar2) {
      local_178 = std::function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)>::
                  operator()(CustomGetSignature,pPSOSign._4_4_);
    }
    else {
      pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
      local_178 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                            (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                             pPSOSign._4_4_);
    }
    if ((local_178 != (PipelineResourceSignatureVkImpl *)0x0) &&
       (UVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetTotalResourceCount
                          (&local_178->
                            super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>),
       UVar3 != 0)) {
      if (7 < pPSOSign._4_4_) {
        FormatString<char[26],char[31]>
                  ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"sign < MAX_RESOURCE_SIGNATURES",(char (*) [31])in_RCX);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        in_RCX = (ShaderResourceCacheImplType *)0xa8b;
        DebugAssertionFailed
                  (pCVar5,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa8b);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      pPVar6 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          *)local_178);
      if (pPVar6->BindingIndex != pPSOSign._4_4_) {
        FormatString<char[26],char[41]>
                  ((string *)&pSRB,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pPSOSign->GetDesc().BindingIndex == sign",(char (*) [41])in_RCX);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa8c);
        std::__cxx11::string::~string((string *)&pSRB);
      }
      std::array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>,_8UL>::operator[]
                (&Resources->SRBs,(ulong)pPSOSign._4_4_);
      RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Lock
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)&pCache);
      ppSVar7 = std::array<Diligent::ShaderResourceCacheVk_*,_8UL>::operator[]
                          (&Resources->ResourceCaches,(ulong)pPSOSign._4_4_);
      pSVar1 = *ppSVar7;
      if (pSVar1 == (value_type)0x0) {
        bVar2 = RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::operator!
                          ((RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *)&pCache);
        if (!bVar2) {
          FormatString<char[100]>
                    ((string *)((long)&msg_5.field_2 + 8),
                     (char (*) [100])
                     "Shader resource cache pointer is null, but SRB is not null. This is unexpected and is likely a bug."
                    );
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xa99);
          std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
        }
      }
      else {
        bVar2 = RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::operator!
                          ((RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *)&pCache);
        if (bVar2) {
          FormatString<char[40],unsigned_int,char[236]>
                    ((string *)((long)&msg_4.field_2 + 8),
                     (Diligent *)"Shader resource cache pointer at index ",
                     (char (*) [40])((long)&pPSOSign + 4),
                     (uint *)
                     " is non-null, but the corresponding SRB is null. This indicates that the SRB has been released while still being used by the context commands. This usage is invalid. A resource must be released only after the last command that uses it."
                     ,(char (*) [236])in_R8);
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xa95);
          std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
        }
      }
      bVar2 = RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::operator!
                        ((RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *)&pCache);
      if (bVar2) {
        pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
        Args = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                         (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
        in_R8 = (PipelineResourceSignatureDesc *)((long)&pPSOSign + 4);
        FormatString<char[17],char_const*,char[25],unsigned_int,char[81]>
                  ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"Pipeline state \'",
                   (char (*) [17])Args,(char **)"\' requires SRB at index ",(char (*) [25])in_R8,
                   (uint *)
                   ", but none is bound in the device context. Did you call CommitShaderResources()?"
                   ,(char (*) [81])in_stack_fffffffffffffe28);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa9d);
        std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
      }
      pSVar8 = &RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::operator->
                          ((RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *)&pCache)->
                super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>;
      in_RCX = ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::GetResourceCache(pSVar8);
      if (pSVar1 != in_RCX) {
        FormatString<char[26],char[36]>
                  ((string *)&pSRBSign,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pCache == &pSRB->GetResourceCache()",(char (*) [36])in_RCX);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        in_RCX = (ShaderResourceCacheImplType *)0xa9f;
        DebugAssertionFailed
                  (pCVar5,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa9f);
        std::__cxx11::string::~string((string *)&pSRBSign);
      }
      pSVar8 = &RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::operator->
                          ((RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *)&pCache)->
                super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>;
      msg_7.field_2._8_8_ =
           ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::GetSignature(pSVar8);
      bVar2 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::IsCompatibleWith
                        (&local_178->
                          super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                         (IPipelineResourceSignature *)msg_7.field_2._8_8_);
      if (!bVar2) {
        in_R8 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                           *)msg_7.field_2._8_8_);
        pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
        in_stack_fffffffffffffe28 =
             PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                       (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
        FormatString<char[34],unsigned_int,char[18],char_const*,char[48],char_const*,char[3]>
                  ((string *)local_158,(Diligent *)"Shader resource binding at index ",
                   (char (*) [34])((long)&pPSOSign + 4),(uint *)" with signature \'",
                   (char (*) [18])in_R8,(char **)"\' is not compatible with the signature in PSO \'"
                   ,(char (*) [48])in_stack_fffffffffffffe28,(char **)"\'.",
                   in_stack_fffffffffffffe38);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        in_RCX = (ShaderResourceCacheImplType *)0xaa4;
        DebugAssertionFailed
                  (pCVar5,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xaa4);
        std::__cxx11::string::~string((string *)local_158);
      }
      RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *)&pCache);
    }
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::DvpVerifySRBCompatibility(
    CommittedShaderResources&                                 Resources,
    std::function<PipelineResourceSignatureImplType*(Uint32)> CustomGetSignature) const
{
    DEV_CHECK_ERR(m_pPipelineState, "No PSO is bound in the context");

    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();
    for (Uint32 sign = 0; sign < SignCount; ++sign)
    {
        const PipelineResourceSignatureImplType* const pPSOSign = CustomGetSignature ? CustomGetSignature(sign) : m_pPipelineState->GetResourceSignature(sign);
        if (pPSOSign == nullptr || pPSOSign->GetTotalResourceCount() == 0)
            continue; // Skip null and empty signatures

        VERIFY_EXPR(sign < MAX_RESOURCE_SIGNATURES);
        VERIFY_EXPR(pPSOSign->GetDesc().BindingIndex == sign);

        RefCntAutoPtr<ShaderResourceBindingImplType> pSRB   = Resources.SRBs[sign].Lock();
        const ShaderResourceCacheImplType*           pCache = Resources.ResourceCaches[sign];
        if (pCache != nullptr)
        {
            DEV_CHECK_ERR(pSRB, "Shader resource cache pointer at index ", sign,
                          " is non-null, but the corresponding SRB is null. This indicates that the SRB has been released while still "
                          "being used by the context commands. This usage is invalid. A resource must be released only after "
                          "the last command that uses it.");
        }
        else
        {
            VERIFY(!pSRB, "Shader resource cache pointer is null, but SRB is not null. This is unexpected and is likely a bug.");
        }

        DEV_CHECK_ERR(pSRB, "Pipeline state '", m_pPipelineState->GetDesc().Name, "' requires SRB at index ", sign,
                      ", but none is bound in the device context. Did you call CommitShaderResources()?");

        VERIFY_EXPR(pCache == &pSRB->GetResourceCache());

        const PipelineResourceSignatureImplType* const pSRBSign = pSRB->GetSignature();
        DEV_CHECK_ERR(pPSOSign->IsCompatibleWith(pSRBSign), "Shader resource binding at index ", sign, " with signature '",
                      pSRBSign->GetDesc().Name, "' is not compatible with the signature in PSO '",
                      m_pPipelineState->GetDesc().Name, "'.");
    }
}